

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::portmap_log_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,portmap_log_alert *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  allocator<char> local_445 [13];
  string local_438;
  char local_418 [8];
  char ret [1024];
  portmap_log_alert *this_local;
  
  uVar1 = *(undefined8 *)((anonymous_namespace)::nat_type_str + (ulong)this->map_transport * 8);
  ret._1016_8_ = this;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_438,&(this->local_address).super_address);
  uVar2 = ::std::__cxx11::string::c_str();
  pcVar3 = log_message(this);
  snprintf(local_418,0x400,"%s [%s]: %s",uVar1,uVar2,pcVar3);
  ::std::__cxx11::string::~string((string *)&local_438);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,local_445);
  ::std::allocator<char>::~allocator(local_445);
  return __return_storage_ptr__;
}

Assistant:

std::string portmap_log_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char ret[1024];
		std::snprintf(ret, sizeof(ret), "%s [%s]: %s"
			, nat_type_str[static_cast<int>(map_transport)]
			, local_address.to_string().c_str()
			, log_message());
		return ret;
#endif
	}